

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_consumer_unittest.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::objectivec::anon_unknown_0::TestLineCollector::ConsumeLine
          (TestLineCollector *this,string_view line,string *out_error)

{
  string *psVar1;
  pointer __s1;
  int iVar2;
  bool bVar3;
  size_t __n;
  AlphaNum *in_R8;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  string local_d0;
  AlphaNum local_b0;
  AlphaNum local_80;
  undefined8 local_50;
  char *local_48;
  
  local_e0._M_str = line._M_str;
  __n = line._M_len;
  psVar1 = this->reject_;
  local_e0._M_len = __n;
  if ((psVar1 == (string *)0x0) || (psVar1->_M_string_length != __n)) {
LAB_00a7b7d0:
    bVar3 = true;
    if ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->lines_ !=
        (vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)0x0) {
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::basic_string_view<char,std::char_traits<char>>&>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this->lines_,
                 &local_e0);
    }
  }
  else {
    __s1 = (psVar1->_M_dataplus)._M_p;
    if (__n != 0) {
      iVar2 = bcmp(__s1,local_e0._M_str,__n);
      if (iVar2 != 0) goto LAB_00a7b7d0;
    }
    if (this->skip_msg_ == false) {
      local_50 = 10;
      local_48 = "Rejected \'";
      local_b0.piece_._M_len = 1;
      local_b0.piece_._M_str = "\'";
      local_80.piece_._M_len = __n;
      local_80.piece_._M_str = __s1;
      absl::lts_20250127::StrCat_abi_cxx11_
                (&local_d0,(lts_20250127 *)&local_50,&local_80,&local_b0,in_R8);
      std::__cxx11::string::operator=((string *)out_error,(string *)&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool ConsumeLine(absl::string_view line, std::string* out_error) override {
    if (reject_ && *reject_ == line) {
      if (!skip_msg_) {
        *out_error = absl::StrCat("Rejected '", *reject_, "'");
      }
      return false;
    }
    if (lines_) {
      lines_->emplace_back(line);
    }
    return true;
  }